

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::unsetPalette(QStyleSheetStyle *this,QWidget *w)

{
  const_iterator it_00;
  byte bVar1;
  bool bVar2;
  QPalette *pQVar3;
  QStyleSheetStyle *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  iterator iVar4;
  piter pVar5;
  QWidget *ew_1;
  QWidget *ew;
  bool useStyleSheetPropagationInWidgetStyles;
  iterator it;
  QPalette original;
  type customizedPalette;
  QVariant oldFont;
  Tampered<QPalette> *in_stack_fffffffffffffef8;
  QStyleSheetStyle *in_stack_ffffffffffffff00;
  iterator *in_stack_ffffffffffffff08;
  undefined1 enabled;
  QStyleSheetStyle *in_stack_ffffffffffffff18;
  QStyleSheetStyle *in_stack_ffffffffffffff20;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
  *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff50;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_> *pDVar6;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_> *pDVar7;
  QStyleSheetStyle *local_88;
  QFont local_80 [16];
  QPalette local_70;
  QPalette local_60;
  undefined1 local_50 [16];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = in_RSI;
  bVar1 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  iVar4 = QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::find
                    ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *)
                     in_stack_ffffffffffffff00,(QWidget **)in_stack_fffffffffffffef8);
  pDVar7 = iVar4.i.d;
  iVar4 = QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::end
                    ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *)
                     in_stack_ffffffffffffff08);
  pDVar6 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
            *)iVar4.i.bucket;
  bVar2 = QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::iterator::operator!=
                    (in_stack_ffffffffffffff08,(iterator *)in_stack_ffffffffffffff00);
  enabled = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  if (bVar2) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::iterator::operator*
              ((iterator *)0x42b236);
    QStyleSheetStyleCaches::Tampered<QPalette>::Tampered
              ((Tampered<QPalette> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    enabled = (undefined1)((ulong)&styleSheetCaches->customPaletteWidgets >> 0x38);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::const_iterator::
    const_iterator((const_iterator *)&stack0xffffffffffffff48,(iterator *)&stack0xffffffffffffff68);
    it_00.i.bucket = (size_t)pDVar7;
    it_00.i.d = pDVar6;
    pVar5 = (piter)QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::erase
                             ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *
                              )in_stack_ffffffffffffff18,it_00);
    local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_50);
    in_stack_ffffffffffffff28 = pVar5.d;
    if ((bVar1 & 1) == 0) {
      QPalette::operator=((QPalette *)local_50,(QPalette *)&local_40);
    }
    else {
      pQVar3 = QWidget::palette((QWidget *)in_stack_ffffffffffffff00);
      QPalette::QPalette(&local_70,(QPalette *)pQVar3);
      in_stack_ffffffffffffff28 = pVar5.d;
      QStyleSheetStyleCaches::Tampered<QPalette>::reverted
                ((Tampered<QPalette> *)pVar5.bucket,(QPalette *)in_stack_ffffffffffffff28);
      QPalette::operator=((QPalette *)in_stack_ffffffffffffff00,
                          &in_stack_fffffffffffffef8->oldWidgetValue);
      QPalette::~QPalette(&local_60);
      QPalette::~QPalette(&local_70);
    }
    QWidget::setPalette((QWidget *)in_stack_ffffffffffffff18,(QPalette *)in_RDI);
    in_stack_ffffffffffffff20 =
         (QStyleSheetStyle *)embeddedWidget((QWidget *)in_stack_ffffffffffffff18);
    if (in_stack_ffffffffffffff20 != local_88) {
      QWidget::setPalette((QWidget *)in_stack_ffffffffffffff18,(QPalette *)in_RDI);
    }
    QPalette::~QPalette((QPalette *)local_50);
    QStyleSheetStyleCaches::Tampered<QPalette>::~Tampered((Tampered<QPalette> *)0x42b397);
  }
  if ((bVar1 & 1) == 0) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QObject::property((char *)local_28.data);
    bVar2 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffff00);
    if (bVar2) {
      qvariant_cast<QFont>((QVariant *)in_stack_ffffffffffffff18);
      QWidget::setFont((QWidget *)in_stack_ffffffffffffff28,(QFont *)in_stack_ffffffffffffff20);
      QFont::~QFont(local_80);
      in_stack_ffffffffffffff00 = local_88;
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  else {
    unsetStyleSheetFont(in_stack_ffffffffffffff18,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff18 =
         (QStyleSheetStyle *)embeddedWidget((QWidget *)in_stack_ffffffffffffff18);
    if (in_stack_ffffffffffffff18 != local_88) {
      unsetStyleSheetFont(in_stack_ffffffffffffff18,in_stack_ffffffffffffff50);
    }
  }
  bVar2 = QSet<const_QWidget_*>::contains
                    ((QSet<const_QWidget_*> *)in_stack_ffffffffffffff00,
                     (QWidget **)in_stack_fffffffffffffef8);
  if (bVar2) {
    embeddedWidget((QWidget *)in_stack_ffffffffffffff18);
    QWidget::setAutoFillBackground(in_RDI,(bool)enabled);
    QSet<const_QWidget_*>::remove(&styleSheetCaches->autoFillDisabledWidgets,(char *)&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::unsetPalette(QWidget *w)
{
    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    const auto it = styleSheetCaches->customPaletteWidgets.find(w);
    if (it != styleSheetCaches->customPaletteWidgets.end()) {
        auto customizedPalette = std::move(*it);
        styleSheetCaches->customPaletteWidgets.erase(it);

        QPalette original;
        if (useStyleSheetPropagationInWidgetStyles)
            original = std::move(customizedPalette).reverted(w->palette());
        else
            original = customizedPalette.oldWidgetValue;

        w->setPalette(original);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            ew->setPalette(original);
    }

    if (useStyleSheetPropagationInWidgetStyles) {
        unsetStyleSheetFont(w);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            unsetStyleSheetFont(ew);
    } else {
        QVariant oldFont = w->property("_q_styleSheetWidgetFont");
        if (oldFont.isValid()) {
            w->setFont(qvariant_cast<QFont>(oldFont));
        }
    }

    if (styleSheetCaches->autoFillDisabledWidgets.contains(w)) {
        embeddedWidget(w)->setAutoFillBackground(true);
        styleSheetCaches->autoFillDisabledWidgets.remove(w);
    }
}